

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O2

void __thiscall
SQCompilation::CodegenVisitor::visitTryStatement(CodegenVisitor *this,TryStatement *tryStmt)

{
  SQObjectPtrVec *this_00;
  SQScope *pSVar1;
  SQInteger *pSVar2;
  long *plVar3;
  size_type sVar4;
  SQFuncState *pSVar5;
  long lVar6;
  long lVar7;
  SQInteger SVar8;
  ulong pos;
  ulong pos_00;
  undefined1 local_58 [16];
  SQScope __oldscope__;
  
  addLineNumber(this,&tryStmt->super_Statement);
  SQFuncState::AddInstruction(this->_fs,_OP_PUSHTRAP,0,0,0,0);
  pSVar5 = this->_fs;
  pSVar5->_traps = pSVar5->_traps + 1;
  sVar4 = (pSVar5->_breaktargets)._size;
  if (sVar4 != 0) {
    plVar3 = (pSVar5->_breaktargets)._vals + (sVar4 - 1);
    *plVar3 = *plVar3 + 1;
  }
  sVar4 = (pSVar5->_continuetargets)._size;
  if (sVar4 != 0) {
    plVar3 = (pSVar5->_continuetargets)._vals + (sVar4 - 1);
    *plVar3 = *plVar3 + 1;
  }
  sVar4 = (pSVar5->_instructions)._size;
  __oldscope__.outers = (this->_scope).outers;
  __oldscope__.stacksize = (this->_scope).stacksize;
  (this->_scope).outers = pSVar5->_outers;
  SVar8 = SQFuncState::GetStackSize(pSVar5);
  (this->_scope).stacksize = SVar8;
  this_00 = &this->_scopedconsts;
  local_58 = ZEXT816(0);
  local_58._0_4_ = OT_NULL;
  sqvector<SQObjectPtr,_unsigned_int>::push_back(this_00,(SQObjectPtr *)local_58);
  pSVar1 = &this->_scope;
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_58);
  Node::visit<SQCompilation::CodegenVisitor>(&tryStmt->_tryStmt->super_Node,this);
  lVar6 = this->_fs->_outers;
  SVar8 = SQFuncState::GetStackSize(this->_fs);
  lVar7 = (this->_scope).stacksize;
  if (SVar8 != lVar7) {
    SQFuncState::SetStackSize(this->_fs,lVar7);
    if (lVar6 != this->_fs->_outers) {
      SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
    }
  }
  pos = (ulong)(sVar4 - 1);
  pSVar1->outers = __oldscope__.outers;
  (this->_scope).stacksize = __oldscope__.stacksize;
  sqvector<SQObjectPtr,_unsigned_int>::pop_back(this_00);
  pSVar5 = this->_fs;
  pSVar2 = &pSVar5->_traps;
  *pSVar2 = *pSVar2 + -1;
  SQFuncState::AddInstruction(pSVar5,_OP_POPTRAP,1,0,0,0);
  pSVar5 = this->_fs;
  sVar4 = (pSVar5->_breaktargets)._size;
  if (sVar4 != 0) {
    plVar3 = (pSVar5->_breaktargets)._vals + (sVar4 - 1);
    *plVar3 = *plVar3 + -1;
  }
  sVar4 = (pSVar5->_continuetargets)._size;
  if (sVar4 != 0) {
    plVar3 = (pSVar5->_continuetargets)._vals + (sVar4 - 1);
    *plVar3 = *plVar3 + -1;
  }
  SQFuncState::AddInstruction(pSVar5,_OP_JMP,0,0,0,0);
  pos_00 = (ulong)((this->_fs->_instructions)._size - 1);
  SQFuncState::SetInstructionParam(this->_fs,pos,1,pos_00 - pos);
  __oldscope__.outers = pSVar1->outers;
  __oldscope__.stacksize = (this->_scope).stacksize;
  pSVar5 = this->_fs;
  (this->_scope).outers = pSVar5->_outers;
  SVar8 = SQFuncState::GetStackSize(pSVar5);
  (this->_scope).stacksize = SVar8;
  local_58._4_12_ = ZEXT412(0);
  local_58._0_4_ = OT_NULL;
  sqvector<SQObjectPtr,_unsigned_int>::push_back(this_00,(SQObjectPtr *)local_58);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_58);
  pSVar5 = this->_fs;
  local_58 = (undefined1  [16])SQFuncState::CreateString(pSVar5,tryStmt->_exception->_id,-1);
  SVar8 = SQFuncState::PushLocalVariable(pSVar5,(SQObject *)local_58,false);
  SQFuncState::SetInstructionParam(this->_fs,pos,0,SVar8);
  Node::visit<SQCompilation::CodegenVisitor>(&tryStmt->_catchStmt->super_Node,this);
  SQFuncState::SetInstructionParams
            (this->_fs,pos_00,0,((this->_fs->_instructions)._size - 1) - pos_00,0,0);
  lVar6 = this->_fs->_outers;
  SVar8 = SQFuncState::GetStackSize(this->_fs);
  lVar7 = (this->_scope).stacksize;
  if (SVar8 != lVar7) {
    SQFuncState::SetStackSize(this->_fs,lVar7);
    if (lVar6 != this->_fs->_outers) {
      SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
    }
  }
  pSVar1->outers = __oldscope__.outers;
  (this->_scope).stacksize = __oldscope__.stacksize;
  sqvector<SQObjectPtr,_unsigned_int>::pop_back(this_00);
  return;
}

Assistant:

void CodegenVisitor::visitTryStatement(TryStatement *tryStmt) {
    addLineNumber(tryStmt);
    _fs->AddInstruction(_OP_PUSHTRAP, 0, 0);
    _fs->_traps++;

    if (_fs->_breaktargets.size()) _fs->_breaktargets.top()++;
    if (_fs->_continuetargets.size()) _fs->_continuetargets.top()++;

    SQInteger trappos = _fs->GetCurrentPos();
    {
        BEGIN_SCOPE();
        tryStmt->tryStatement()->visit(this);
        END_SCOPE();
    }

    _fs->_traps--;
    _fs->AddInstruction(_OP_POPTRAP, 1, 0);
    if (_fs->_breaktargets.size()) _fs->_breaktargets.top()--;
    if (_fs->_continuetargets.size()) _fs->_continuetargets.top()--;
    _fs->AddInstruction(_OP_JMP, 0, 0);
    SQInteger jmppos = _fs->GetCurrentPos();
    _fs->SetInstructionParam(trappos, 1, (_fs->GetCurrentPos() - trappos));

    {
        BEGIN_SCOPE();
        SQInteger ex_target = _fs->PushLocalVariable(_fs->CreateString(tryStmt->exceptionId()->id()), false);
        _fs->SetInstructionParam(trappos, 0, ex_target);
        tryStmt->catchStatement()->visit(this);
        _fs->SetInstructionParams(jmppos, 0, (_fs->GetCurrentPos() - jmppos), 0);
        END_SCOPE();
    }
}